

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

string * __thiscall
Assimp::XFileParser::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,XFileParser *this)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  _Alloc_hider local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_68 = 0;
  local_60 = '\0';
  local_70._M_p = &local_60;
  if (this->mIsBinaryFormat != true) {
    FindNextNoneWhiteSpace(this);
    if (this->mP < this->mEnd) {
      while (pbVar2 = (byte *)this->mP, pbVar2 < this->mEnd) {
        bVar1 = *pbVar2;
        iVar5 = isspace((uint)bVar1);
        if (iVar5 != 0) break;
        if (bVar1 < 0x7b) {
          if ((bVar1 == 0x2c) || (bVar1 == 0x3b)) goto LAB_00619735;
        }
        else if ((bVar1 == 0x7d) || (bVar1 == 0x7b)) {
LAB_00619735:
          if (local_68 == 0) {
            this->mP = (char *)(pbVar2 + 1);
            std::__cxx11::string::append((char *)&local_70,(ulong)pbVar2);
          }
          break;
        }
        this->mP = (char *)(pbVar2 + 1);
        std::__cxx11::string::append((char *)&local_70,(ulong)pbVar2);
      }
      goto switchD_00619632_caseD_4;
    }
LAB_0061971b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_00619787;
  }
  if ((long)this->mEnd - (long)this->mP < 2) goto LAB_0061971b;
  uVar4 = ReadBinWord(this);
  switch(uVar4) {
  case 1:
    if (((3 < (long)this->mEnd - (long)this->mP) && (uVar6 = ReadBinDWord(this), -1 < (int)uVar6))
       && (pcVar3 = this->mP, (int)uVar6 <= *(int *)&this->mEnd - (int)pcVar3)) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar3,pcVar3 + uVar6);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      this->mP = this->mP + uVar6;
    }
    goto switchD_00619632_caseD_4;
  case 2:
    if (3 < (long)this->mEnd - (long)this->mP) {
      uVar6 = ReadBinDWord(this);
      pcVar3 = this->mP;
      if ((long)(int)uVar6 <= (long)this->mEnd - (long)pcVar3) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar3,pcVar3 + uVar6);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        this->mP = this->mP + (uVar6 + 2);
      }
    }
    goto switchD_00619632_caseD_4;
  case 3:
    this->mP = this->mP + 4;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<integer>","")
    ;
    break;
  default:
    goto switchD_00619632_caseD_4;
  case 5:
    this->mP = this->mP + 0x10;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<guid>","");
    break;
  case 6:
    if (3 < (long)this->mEnd - (long)this->mP) {
      uVar6 = ReadBinDWord(this);
      this->mP = this->mP + (uVar6 << 2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"<int_list>","");
      break;
    }
    goto switchD_00619632_caseD_4;
  case 7:
    if (3 < (long)this->mEnd - (long)this->mP) {
      uVar6 = ReadBinDWord(this);
      this->mP = this->mP + uVar6 * this->mBinaryFloatSize;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"<flt_list>","");
      break;
    }
switchD_00619632_caseD_4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_70._M_p == &local_60) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    __return_storage_ptr__->_M_string_length = local_68;
LAB_00619787:
    local_68 = 0;
    local_60 = '\0';
    local_70._M_p = &local_60;
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{","");
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"}","");
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,")","");
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"]","");
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<","");
    break;
  case 0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,">","");
    break;
  case 0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,".","");
    break;
  case 0x13:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,",","");
    break;
  case 0x14:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,";","");
    break;
  case 0x1f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"template","");
    break;
  case 0x28:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"WORD","");
    break;
  case 0x29:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"DWORD","");
    break;
  case 0x2a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"FLOAT","");
    break;
  case 0x2b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"DOUBLE","");
    break;
  case 0x2c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"CHAR","");
    break;
  case 0x2d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"UCHAR","");
    break;
  case 0x2e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"SWORD","");
    break;
  case 0x2f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"SDWORD","");
    break;
  case 0x30:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"void","");
    break;
  case 0x31:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"string","");
    break;
  case 0x32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unicode","");
    break;
  case 0x33:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"cstring","");
    break;
  case 0x34:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"array","");
  }
  if (local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFileParser::GetNextToken() {
    std::string s;

    // process binary-formatted file
    if( mIsBinaryFormat) {
        // in binary mode it will only return NAME and STRING token
        // and (correctly) skip over other tokens.
        if ( mEnd - mP < 2 ) {
            return s;
        }
        unsigned int tok = ReadBinWord();
        unsigned int len;

        // standalone tokens
        switch( tok ) {
            case 1: {
                // name token
                if ( mEnd - mP < 4 ) {
                    return s;
                }
                len = ReadBinDWord();
                const int bounds = int( mEnd - mP );
                const int iLen   = int( len );
                if ( iLen < 0 ) {
                    return s;
                }
                if ( bounds < iLen ) {
                    return s;
                }
                s = std::string( mP, len );
                mP += len;
            }
            return s;

            case 2:
                // string token
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                if( mEnd - mP < int(len)) return s;
                s = std::string(mP, len);
                mP += (len + 2);
                return s;
            case 3:
                // integer token
                mP += 4;
                return "<integer>";
            case 5:
                // GUID token
                mP += 16;
                return "<guid>";
            case 6:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * 4);
                return "<int_list>";
            case 7:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * mBinaryFloatSize);
                return "<flt_list>";
            case 0x0a:
                return "{";
            case 0x0b:
                return "}";
            case 0x0c:
                return "(";
            case 0x0d:
                return ")";
            case 0x0e:
                return "[";
            case 0x0f:
                return "]";
            case 0x10:
                return "<";
            case 0x11:
                return ">";
            case 0x12:
                return ".";
            case 0x13:
                return ",";
            case 0x14:
                return ";";
            case 0x1f:
                return "template";
            case 0x28:
                return "WORD";
            case 0x29:
                return "DWORD";
            case 0x2a:
                return "FLOAT";
            case 0x2b:
                return "DOUBLE";
            case 0x2c:
                return "CHAR";
            case 0x2d:
                return "UCHAR";
            case 0x2e:
                return "SWORD";
            case 0x2f:
                return "SDWORD";
            case 0x30:
                return "void";
            case 0x31:
                return "string";
            case 0x32:
                return "unicode";
            case 0x33:
                return "cstring";
            case 0x34:
                return "array";
        }
    }
    // process text-formatted file
    else
    {
        FindNextNoneWhiteSpace();
        if( mP >= mEnd)
            return s;

        while( (mP < mEnd) && !isspace( (unsigned char) *mP))
        {
            // either keep token delimiters when already holding a token, or return if first valid char
            if( *mP == ';' || *mP == '}' || *mP == '{' || *mP == ',')
            {
                if( !s.size())
                    s.append( mP++, 1);
                break; // stop for delimiter
            }
            s.append( mP++, 1);
        }
    }
    return s;
}